

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.c
# Opt level: O0

void nni_reap_sys_fini(void)

{
  nni_mtx_lock(&reap_mtx);
  reap_exit = true;
  nni_cv_wake1(&reap_work_cv);
  nni_mtx_unlock(&reap_mtx);
  nni_thr_fini(&reap_thr);
  nni_cv_fini(&reap_work_cv);
  nni_cv_fini(&reap_empty_cv);
  nni_mtx_fini(&reap_mtx);
  return;
}

Assistant:

void
nni_reap_sys_fini(void)
{
	nni_mtx_lock(&reap_mtx);
	reap_exit = true;
	nni_cv_wake1(&reap_work_cv);
	nni_mtx_unlock(&reap_mtx);
	nni_thr_fini(&reap_thr);

	nni_cv_fini(&reap_work_cv);
	nni_cv_fini(&reap_empty_cv);
	nni_mtx_fini(&reap_mtx);

	// NB: The subsystem linkages remain in place.  We don't need
	// to reinitialize them across future initializations.
}